

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool proxy_info_matches(proxy_info *data,proxy_info *needle)

{
  int iVar1;
  
  if ((data->proxytype == needle->proxytype) && (data->port == needle->port)) {
    iVar1 = Curl_safe_strcasecompare((data->host).name,(needle->host).name);
    if (iVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool
proxy_info_matches(const struct proxy_info* data,
                   const struct proxy_info* needle)
{
  if((data->proxytype == needle->proxytype) &&
     (data->port == needle->port) &&
     Curl_safe_strcasecompare(data->host.name, needle->host.name))
    return TRUE;

  return FALSE;
}